

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O2

int add_blocks(int n,byte *left,byte *right)

{
  long lVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  
  uVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    uVar2 = (uint)left[lVar1] + uVar2 + *(byte *)(CONCAT44(in_register_0000003c,n) + lVar1);
    *(char *)(CONCAT44(in_register_0000003c,n) + lVar1) = (char)uVar2;
    uVar2 = uVar2 >> 8;
  }
  return 0x20;
}

Assistant:

static int add_blocks(int n, byte * left, const byte * right)
{
    int i;
    int carry = 0;
    for (i = 0; i < n; i++) {
        int sum = (int)left[i] + (int)right[i] + carry;
        left[i] = sum & 0xff;
        carry = sum >> 8;
    }
    return carry;
}